

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-types.cpp
# Opt level: O0

bool wasm::anon_unknown_24::isUninhabitable
               (Type type,
               unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
               *visited,unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
                        *visiting)

{
  bool bVar1;
  HeapType type_00;
  bool local_41;
  HeapType local_38;
  HeapType local_30;
  unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
  *local_28;
  unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
  *visiting_local;
  unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
  *visited_local;
  Type type_local;
  
  local_28 = visiting;
  visiting_local = visited;
  visited_local =
       (unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
        *)type.id;
  bVar1 = Type::isRef((Type *)&visited_local);
  if ((bVar1) && (bVar1 = Type::isNonNullable((Type *)&visited_local), bVar1)) {
    local_30 = Type::getHeapType((Type *)&visited_local);
    bVar1 = HeapType::isBottom(&local_30);
    local_41 = true;
    if (!bVar1) {
      local_38 = Type::getHeapType((Type *)&visited_local);
      local_41 = HeapType::isMaybeShared(&local_38,ext);
    }
    if (local_41 == false) {
      type_00 = Type::getHeapType((Type *)&visited_local);
      type_local.id._7_1_ = isUninhabitable(type_00,visiting_local,local_28);
    }
    else {
      type_local.id._7_1_ = true;
    }
  }
  else {
    type_local.id._7_1_ = false;
  }
  return type_local.id._7_1_;
}

Assistant:

bool isUninhabitable(Type type,
                     std::unordered_set<HeapType>& visited,
                     std::unordered_set<HeapType>& visiting) {
  if (type.isRef() && type.isNonNullable()) {
    if (type.getHeapType().isBottom() ||
        type.getHeapType().isMaybeShared(HeapType::ext)) {
      return true;
    }
    return isUninhabitable(type.getHeapType(), visited, visiting);
  }
  return false;
}